

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  string *psVar1;
  bool bVar2;
  ValueType VVar3;
  ArrayIndex AVar4;
  Json *pJVar5;
  Value *pVVar6;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 uVar7;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  bool value_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar8;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  char cVar9;
  ArrayIndex index;
  pointer key;
  double value_01;
  string sStack_68;
  Members members;
  
  pVVar6 = value;
  VVar3 = Value::type(value);
  switch(VVar3) {
  case nullValue:
    if (this->dropNullPlaceholders_ != false) {
      return;
    }
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case intValue:
    pJVar5 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&sStack_68,pJVar5,CONCAT71(extraout_var_04,extraout_DL_04));
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case uintValue:
    pJVar5 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&sStack_68,pJVar5,CONCAT71(extraout_var_00,extraout_DL_00));
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case realValue:
    value_01 = Value::asDouble(value);
    valueToString_abi_cxx11_(&sStack_68,(Json *)pVVar6,value_01);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case stringValue:
    pJVar5 = (Json *)Value::asCString(value);
    valueToQuotedString_abi_cxx11_(&sStack_68,pJVar5,(char *)CONCAT71(extraout_var,extraout_DL));
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case booleanValue:
    bVar2 = Value::asBool(value);
    valueToString_abi_cxx11_(&sStack_68,(Json *)(ulong)bVar2,value_00);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case arrayValue:
    cVar9 = (char)this + '\b';
    std::__cxx11::string::push_back(cVar9);
    AVar4 = Value::size(value);
    index = 0;
    if ((int)AVar4 < 1) {
      AVar4 = 0;
    }
    for (; AVar4 != index; index = index + 1) {
      if (index != 0) {
        std::__cxx11::string::push_back(cVar9);
      }
      pVVar6 = Value::operator[](value,index);
      writeValue(this,pVVar6);
    }
    std::__cxx11::string::push_back(cVar9);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(&members,value);
    psVar1 = &this->document_;
    cVar9 = (char)psVar1;
    std::__cxx11::string::push_back(cVar9);
    uVar7 = extraout_DL_01;
    uVar8 = extraout_var_01;
    for (key = members.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        key != members.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; key = key + 1) {
      if (key != members.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::push_back(cVar9);
        uVar7 = extraout_DL_02;
        uVar8 = extraout_var_02;
      }
      valueToQuotedString_abi_cxx11_
                (&sStack_68,(Json *)(key->_M_dataplus)._M_p,(char *)CONCAT71(uVar8,uVar7));
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&sStack_68);
      std::__cxx11::string::append((char *)psVar1);
      pVVar6 = Value::operator[](value,key);
      writeValue(this,pVVar6);
      uVar7 = extraout_DL_03;
      uVar8 = extraout_var_03;
    }
    std::__cxx11::string::push_back(cVar9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&members);
  default:
    goto switchD_00474029_default;
  }
  std::__cxx11::string::~string((string *)&sStack_68);
switchD_00474029_default:
  return;
}

Assistant:

void FastWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    if (!dropNullPlaceholders_)
      document_ += "null";
    break;
  case intValue:
    document_ += valueToString(value.asLargestInt());
    break;
  case uintValue:
    document_ += valueToString(value.asLargestUInt());
    break;
  case realValue:
    document_ += valueToString(value.asDouble());
    break;
  case stringValue:
    document_ += valueToQuotedString(value.asCString());
    break;
  case booleanValue:
    document_ += valueToString(value.asBool());
    break;
  case arrayValue: {
    document_ += '[';
    int size = value.size();
    for (int index = 0; index < size; ++index) {
      if (index > 0)
        document_ += ',';
      writeValue(value[index]);
    }
    document_ += ']';
  } break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    document_ += '{';
    for (Value::Members::iterator it = members.begin(); it != members.end();
         ++it) {
      const std::string& name = *it;
      if (it != members.begin())
        document_ += ',';
      document_ += valueToQuotedString(name.c_str());
      document_ += yamlCompatiblityEnabled_ ? ": " : ":";
      writeValue(value[name]);
    }
    document_ += '}';
  } break;
  }
}